

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

cmJSONHelper<std::string> *
cmJSONHelperBuilder::String
          (cmJSONHelper<std::string> *__return_storage_ptr__,ErrorGenerator *error,string *defval)

{
  undefined1 local_50 [64];
  
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::function
            ((function<void_(const_Json::Value_*,_cmJSONState_*)> *)local_50,error);
  std::__cxx11::string::string((string *)(local_50 + 0x20),(string *)defval);
  std::function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>::
  function<cmJSONHelperBuilder::String(std::function<void(Json::Value_const*,cmJSONState*)>const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(std::__cxx11::string&,Json::Value_const*,cmJSONState*)> *)
             __return_storage_ptr__,(anon_class_64_2_ce0a3bf5 *)local_50);
  String(std::function<void(Json::Value_const*,cmJSONState*)>const&,std::__cxx11::string_const&)::
  {lambda(std::__cxx11::string&,Json::Value_const*,cmJSONState*)#1}::~basic_string
            ((_lambda_std____cxx11__string__Json__Value_const__cmJSONState___1_ *)local_50);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<std::string> String(
    const JsonErrors::ErrorGenerator& error = JsonErrors::INVALID_STRING,
    const std::string& defval = "")
  {
    return [error, defval](std::string& out, const Json::Value* value,
                           cmJSONState* state) -> bool {
      if (!value) {
        out = defval;
        return true;
      }
      if (!value->isString()) {
        error(value, state);
        ;
        return false;
      }
      out = value->asString();
      return true;
    };
  }